

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

void inform_pid_lattice_free(inform_pid_lattice *lattice)

{
  inform_pid_lattice *lattice_local;
  
  if (lattice != (inform_pid_lattice *)0x0) {
    free_all_sources(lattice->sources);
    lattice->sources = (inform_pid_source **)0x0;
    lattice->top = (inform_pid_source *)0x0;
    lattice->bottom = (inform_pid_source *)0x0;
    free(lattice);
  }
  return;
}

Assistant:

void inform_pid_lattice_free(inform_pid_lattice *lattice)
{
    if (lattice)
    {
        free_all_sources(lattice->sources);

        lattice->sources = NULL;
        lattice->top = NULL;
        lattice->bottom = NULL;

        free(lattice);
    }
}